

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O1

void __thiscall deqp::gls::RandomShaderCase::deinit(RandomShaderCase *this)

{
  TextureCube *this_00;
  pointer puVar1;
  
  if (this->m_tex2D != (Texture2D *)0x0) {
    (*this->m_tex2D->_vptr_Texture2D[1])();
  }
  this_00 = this->m_texCube;
  if (this_00 != (TextureCube *)0x0) {
    glu::TextureCube::~TextureCube(this_00);
    operator_delete(this_00,0x180);
  }
  this->m_tex2D = (Texture2D *)0x0;
  this->m_texCube = (TextureCube *)0x0;
  std::vector<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>::_M_erase_at_end
            (&this->m_vertexArrays,
             (this->m_vertexArrays).
             super__Vector_base<deqp::gls::VertexArray,_std::allocator<deqp::gls::VertexArray>_>.
             _M_impl.super__Vector_impl_data._M_start);
  puVar1 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  return;
}

Assistant:

void RandomShaderCase::deinit (void)
{
	delete m_tex2D;
	delete m_texCube;

	m_tex2D		= DE_NULL;
	m_texCube	= DE_NULL;

	// Free up memory
	m_vertexArrays.clear();
	m_indices.clear();
}